

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextboundaryfinder.cpp
# Opt level: O0

void __thiscall
QTextBoundaryFinder::QTextBoundaryFinder(QTextBoundaryFinder *this,QTextBoundaryFinder *other)

{
  void *__src;
  qsizetype qVar1;
  void *pvVar2;
  undefined4 *in_RSI;
  undefined4 *in_RDI;
  QString *in_stack_ffffffffffffffb8;
  QString *in_stack_ffffffffffffffc0;
  
  *in_RDI = *in_RSI;
  QString::QString(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  *(undefined8 *)(in_RDI + 8) = *(undefined8 *)(in_RSI + 8);
  *(undefined8 *)(in_RDI + 10) = *(undefined8 *)(in_RSI + 10);
  *(undefined8 *)(in_RDI + 0xc) = *(undefined8 *)(in_RSI + 0xc);
  in_RDI[0xe] = in_RDI[0xe] & 0xfffffffe | 1;
  *(undefined8 *)(in_RDI + 0x10) = 0;
  if (*(long *)(in_RSI + 0x10) != 0) {
    qVar1 = QStringView::size((QStringView *)(in_RDI + 8));
    pvVar2 = malloc(qVar1 + 1);
    *(void **)(in_RDI + 0x10) = pvVar2;
    if (*(long *)(in_RDI + 0x10) == 0) {
      qBadAlloc();
    }
    pvVar2 = *(void **)(in_RDI + 0x10);
    __src = *(void **)(in_RSI + 0x10);
    qVar1 = QStringView::size((QStringView *)(in_RDI + 8));
    memcpy(pvVar2,__src,qVar1 + 1);
  }
  return;
}

Assistant:

QTextBoundaryFinder::QTextBoundaryFinder(const QTextBoundaryFinder &other)
    : t(other.t)
    , s(other.s)
    , sv(other.sv)
    , pos(other.pos)
    , freeBuffer(true)
{
    if (other.attributes) {
        Q_ASSERT(sv.size() > 0);
        attributes = (QCharAttributes *) malloc((sv.size() + 1) * sizeof(QCharAttributes));
        Q_CHECK_PTR(attributes);
        memcpy(attributes, other.attributes, (sv.size() + 1) * sizeof(QCharAttributes));
    }
}